

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O0

void __thiscall
cmCommandArgumentGroup::FollowsGroup(cmCommandArgumentGroup *this,cmCommandArgumentGroup *group)

{
  bool bVar1;
  reference ppcVar2;
  cmCommandArgument *ca;
  iterator __end1;
  iterator __begin1;
  vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_> *__range1;
  cmCommandArgumentGroup *group_local;
  cmCommandArgumentGroup *this_local;
  
  __end1 = std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::begin
                     (&this->ContainedArguments);
  ca = (cmCommandArgument *)
       std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::end
                 (&this->ContainedArguments);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmCommandArgument_**,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
                                *)&ca);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmCommandArgument_**,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
              ::operator*(&__end1);
    cmCommandArgument::FollowsGroup(*ppcVar2,group);
    __gnu_cxx::
    __normal_iterator<cmCommandArgument_**,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmCommandArgumentGroup::FollowsGroup(const cmCommandArgumentGroup* group)
{
  for (cmCommandArgument* ca : this->ContainedArguments) {
    ca->FollowsGroup(group);
  }
}